

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

bool __thiscall Database::empty(Database *this)

{
  bool bVar1;
  iterator local_50;
  iterator local_30;
  Database *local_10;
  Database *this_local;
  
  local_10 = this;
  begin(&local_30,this);
  end(&local_50,this);
  bVar1 = iterator::operator==(&local_30,&local_50);
  return bVar1;
}

Assistant:

bool Database::empty ()
{
  return Database::begin () == Database::end ();
}